

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *__s;
  ulong uVar1;
  string *in_RDI;
  allocator local_55 [19];
  byte local_42;
  allocator<char> local_41;
  char *local_40;
  char *colon;
  char *gtest_output_flag;
  string s;
  
  std::__cxx11::string::string((string *)&gtest_output_flag,(string *)FLAGS_gtest_output_abi_cxx11_)
  ;
  colon = (char *)std::__cxx11::string::c_str();
  local_40 = strchr(colon,0x3a);
  __s = colon;
  local_42 = 0;
  if (local_40 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_41);
  }
  else {
    uVar1 = (long)local_40 - (long)colon;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,__s,uVar1,local_55);
    std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  std::__cxx11::string::~string((string *)&gtest_output_flag);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}